

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyserunits.cpp
# Opt level: O1

void __thiscall AnalyserUnits_divide_Test::TestBody(AnalyserUnits_divide_Test *this)

{
  char cVar1;
  long *plVar2;
  char *pcVar3;
  long lVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ScopedTrace gtest_trace_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expectedIssues;
  ModelPtr model;
  ParserPtr parser;
  AnalyserPtr analyser;
  ScopedTrace local_189;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_180;
  undefined1 local_178 [32];
  string local_158 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_150;
  undefined1 local_148 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 *local_118 [2];
  undefined1 local_108 [16];
  undefined1 *local_f8 [2];
  undefined1 local_e8 [16];
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long *local_38 [2];
  long local_28 [2];
  
  libcellml::Parser::create(SUB81(local_148,0));
  local_178._0_8_ = (pointer)(local_178 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"analyser/units/divide.cellml","");
  fileContents((string *)&local_138);
  libcellml::Parser::parseModel(local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
    operator_delete((void *)local_178._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_178._16_8_)->_M_p + 1));
  }
  local_178._0_8_ = (pointer)0x0;
  local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_138,"size_t(0)","parser->issueCount()",(unsigned_long *)local_178,
             (unsigned_long *)&local_188);
  if ((char)local_138._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_178);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)(undefined1 *)local_138._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
               ,0x154,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_188,(Message *)local_178);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_188);
    if ((pointer)local_178._0_8_ != (pointer)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && ((pointer)local_178._0_8_ != (pointer)0x0)) {
        (**(code **)(((_Alloc_hider *)local_178._0_8_)->_M_p + 8))();
      }
      local_178._0_8_ = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_138._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_138,
             "The units in \'b = bCst/3.0\' in component \'main\' are not equivalent. \'b\' is \'dimensionless\' while \'bCst/3.0\' is in \'second\'."
             ,"");
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_118,
             "The units in \'c = cCst/5.0\' in component \'main\' are not equivalent. \'c\' is \'dimensionless\' while \'cCst/5.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,"");
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f8,
             "The units in \'d = dCst/7.0\' in component \'main\' are not equivalent. \'d\' is \'dimensionless\' while \'dCst/7.0\' is in \'frog\'."
             ,"");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,
             "The units in \'e = eCst/9.0\' in component \'main\' are not equivalent. \'e\' is \'dimensionless\' while \'eCst/9.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,"");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "The units in \'f = fCst/11.0\' in component \'main\' are not equivalent. \'f\' is \'dimensionless\' while \'fCst/11.0\' is in \'imaginary^-1 x second\' (i.e. \'10^30 x ampere^6 x frog^-10 x kilogram^-6 x metre^-12 x second^17\')."
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "The units in \'g = gCst/13.0\' in component \'main\' are not equivalent. \'g\' is in \'second_per_volt\' (i.e. \'ampere x kilogram^-1 x metre^-2 x second^4\') while \'gCst/13.0\' is in \'second\'."
             ,"");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "The units in \'h = hCst/15.0\' in component \'main\' are not equivalent. \'h\' is in \'volt_per_volt\' while \'hCst/15.0\' is in \'volt\' (i.e. \'ampere^-1 x kilogram x metre^2 x second^-3\')."
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "The units in \'i = iCst/17.0\' in component \'main\' are not equivalent. \'i\' is in \'frog_per_volt\' (i.e. \'ampere x frog x kilogram^-1 x metre^-2 x second^3\') while \'iCst/17.0\' is in \'frog\'."
             ,"");
  plVar2 = local_28;
  local_38[0] = plVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_38,
             "The units in \'j = jCst/19.0\' in component \'main\' are not equivalent. \'j\' is in \'imaginary_per_volt\' (i.e. \'10^-30 x ampere^-5 x frog^10 x kilogram^5 x metre^10 x second^-13\') while \'jCst/19.0\' is in \'imaginary\' (i.e. \'10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16\')."
             ,"");
  __l._M_len = 9;
  __l._M_array = &local_138;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_178,__l,(allocator_type *)&local_188);
  lVar4 = -0x120;
  do {
    if (plVar2 != (long *)plVar2[-2]) {
      operator_delete((long *)plVar2[-2],*plVar2 + 1);
    }
    plVar2 = plVar2 + -4;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0);
  libcellml::Analyser::create();
  libcellml::Analyser::analyseModel((shared_ptr *)local_138._M_dataplus._M_p);
  testing::ScopedTrace::ScopedTrace
            (&local_189,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/analyser/analyserunits.cpp"
             ,0x166,"Issue occurred here.");
  local_188 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p;
  local_180 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_138._M_string_length + 8) = *(int *)(local_138._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_138._M_string_length + 8) = *(int *)(local_138._M_string_length + 8) + 1;
    }
  }
  expectEqualIssues((vector *)local_178,(shared_ptr *)&local_188);
  if (local_180 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_180);
  }
  testing::ScopedTrace::~ScopedTrace(&local_189);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._M_string_length);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  if (local_150 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_150);
  }
  if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
  }
  return;
}

Assistant:

TEST(AnalyserUnits, divide)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("analyser/units/divide.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    const std::vector<std::string> expectedIssues = {
        "The units in 'b = bCst/3.0' in component 'main' are not equivalent. 'b' is 'dimensionless' while 'bCst/3.0' is in 'second'.",
        "The units in 'c = cCst/5.0' in component 'main' are not equivalent. 'c' is 'dimensionless' while 'cCst/5.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'd = dCst/7.0' in component 'main' are not equivalent. 'd' is 'dimensionless' while 'dCst/7.0' is in 'frog'.",
        "The units in 'e = eCst/9.0' in component 'main' are not equivalent. 'e' is 'dimensionless' while 'eCst/9.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
        "The units in 'f = fCst/11.0' in component 'main' are not equivalent. 'f' is 'dimensionless' while 'fCst/11.0' is in 'imaginary^-1 x second' (i.e. '10^30 x ampere^6 x frog^-10 x kilogram^-6 x metre^-12 x second^17').",
        "The units in 'g = gCst/13.0' in component 'main' are not equivalent. 'g' is in 'second_per_volt' (i.e. 'ampere x kilogram^-1 x metre^-2 x second^4') while 'gCst/13.0' is in 'second'.",
        "The units in 'h = hCst/15.0' in component 'main' are not equivalent. 'h' is in 'volt_per_volt' while 'hCst/15.0' is in 'volt' (i.e. 'ampere^-1 x kilogram x metre^2 x second^-3').",
        "The units in 'i = iCst/17.0' in component 'main' are not equivalent. 'i' is in 'frog_per_volt' (i.e. 'ampere x frog x kilogram^-1 x metre^-2 x second^3') while 'iCst/17.0' is in 'frog'.",
        "The units in 'j = jCst/19.0' in component 'main' are not equivalent. 'j' is in 'imaginary_per_volt' (i.e. '10^-30 x ampere^-5 x frog^10 x kilogram^5 x metre^10 x second^-13') while 'jCst/19.0' is in 'imaginary' (i.e. '10^-30 x ampere^-6 x frog^10 x kilogram^6 x metre^12 x second^-16').",
    };

    auto analyser = libcellml::Analyser::create();

    analyser->analyseModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, analyser);
}